

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::findCompositeConstant(Builder *this,Op typeClass,Vector<Id> *comps)

{
  pointer ppIVar1;
  pointer puVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  Instruction *pIVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (typeClass == OpTypeCooperativeMatrixKHR) {
    ppIVar1 = (this->coopmatConstants).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (uint)((ulong)((long)(this->coopmatConstants).
                                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
    if (0 < (int)uVar5) {
      uVar9 = 1;
      bVar4 = false;
      do {
        pIVar6 = ppIVar1[uVar9 - 1];
        if (*(pIVar6->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start ==
            *(comps->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
             )._M_impl.super__Vector_impl_data._M_start) {
          bVar4 = true;
        }
      } while ((uVar9 < (uVar5 & 0x7fffffff)) && (uVar9 = uVar9 + 1, !bVar4));
      if (bVar4) {
LAB_001b33e7:
        return pIVar6->resultId;
      }
    }
  }
  else {
    ppIVar1 = this->groupedConstants[typeClass].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (ulong)((long)this->groupedConstants[typeClass].
                          super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
    if (0 < (int)uVar9) {
      puVar2 = (comps->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (ulong)((long)(comps->
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2;
      uVar10 = 0;
      do {
        pIVar6 = ppIVar1[uVar10];
        lVar3 = *(long *)&(pIVar6->operands).
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data;
        iVar7 = (int)uVar8;
        if ((int)((ulong)((long)*(pointer *)
                                 ((long)&(pIVar6->operands).
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         ._M_impl + 8) - lVar3) >> 2) == iVar7) {
          if (iVar7 < 1) goto LAB_001b33e7;
          uVar11 = 0;
          while (*(uint *)(lVar3 + uVar11 * 4) == puVar2[uVar11]) {
            uVar11 = uVar11 + 1;
            if ((uVar8 & 0x7fffffff) == uVar11) goto LAB_001b33e7;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar9 & 0x7fffffff));
    }
  }
  return 0;
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, const dxil_spv::Vector<Id>& comps) const
{
    Instruction* constant = 0;
    bool found = false;

    if (typeClass == spv::OpTypeCooperativeMatrixKHR) {
        for (int i = 0; i < (int)coopmatConstants.size() && !found; ++i) {
            constant = coopmatConstants[i];
            if (constant->getIdOperand(0) == comps[0])
                found = true;
        }
    } else {
        for (int i = 0; i < (int) groupedConstants[typeClass].size(); ++i) {
            constant = groupedConstants[typeClass][i];

            // same shape?
            if (constant->getNumOperands() != (int) comps.size())
                continue;

            // same contents?
            bool mismatch = false;
            for (int op = 0; op < constant->getNumOperands(); ++op)
            {
                if (constant->getIdOperand(op) != comps[op])
                {
                    mismatch = true;
                    break;
                }
            }
            if (!mismatch)
            {
                found = true;
                break;
            }
        }
    }

    return found ? constant->getResultId() : NoResult;
}